

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph.c
# Opt level: O2

void mpr_clear_addr_set(avl_tree *set)

{
  list_entity *plVar1;
  list_entity *plVar2;
  
  plVar2 = (set->list_head).next;
  while (plVar2->prev != (set->list_head).prev) {
    plVar1 = plVar2 + -2;
    plVar2 = plVar2->next;
    avl_remove(set);
    free(&plVar1->prev);
  }
  return;
}

Assistant:

void
mpr_clear_addr_set(struct avl_tree *set) {
  struct addr_node *current_node, *node_it;

  avl_for_each_element_safe(set, current_node, _avl_node, node_it) {
    avl_remove(set, &current_node->_avl_node);
    free(current_node);
  }
}